

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UnbasedUnsizedIntegerLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnbasedUnsizedIntegerLiteral,slang::ast::Type_const&,slang::logic_t&,slang::SourceRange>
          (BumpAllocator *this,Type *args,logic_t *args_1,SourceRange *args_2)

{
  uint8_t uVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  UnbasedUnsizedIntegerLiteral *pUVar4;
  
  pUVar4 = (UnbasedUnsizedIntegerLiteral *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnbasedUnsizedIntegerLiteral *)this->endPtr < pUVar4 + 1) {
    pUVar4 = (UnbasedUnsizedIntegerLiteral *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pUVar4 + 1);
  }
  uVar1 = args_1->value;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pUVar4->super_Expression).kind = UnbasedUnsizedIntegerLiteral;
  (pUVar4->super_Expression).type.ptr = args;
  (pUVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pUVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pUVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pUVar4->super_Expression).sourceRange.endLoc = SVar3;
  (pUVar4->value).value = uVar1;
  return pUVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }